

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O0

void __thiscall wasm::FindAll<wasm::GlobalGet>::~FindAll(FindAll<wasm::GlobalGet> *this)

{
  FindAll<wasm::GlobalGet> *this_local;
  
  std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::~vector(&this->list);
  return;
}

Assistant:

FindAll(Expression* ast) {
    struct Finder
      : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
      std::vector<T*>* list;
      void visitExpression(Expression* curr) {
        if (curr->is<T>()) {
          (*list).push_back(curr->cast<T>());
        }
      }
    };
    Finder finder;
    finder.list = &list;
    finder.walk(ast);
  }